

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O0

ostream * __thiscall tcu::Format::Hex<2UL>::toStream(Hex<2UL> *this,ostream *stream)

{
  ostream *poVar1;
  string local_38;
  ostream *local_18;
  ostream *stream_local;
  Hex<2UL> *this_local;
  
  local_18 = stream;
  stream_local = (ostream *)this;
  Hex<2ul>::toString_abi_cxx11_(&local_38,this);
  poVar1 = std::operator<<(stream,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return poVar1;
}

Assistant:

std::ostream& toStream (std::ostream& stream) const
	{
		return stream << this->toString();
	}